

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O3

double __thiscall agg::bspline::get(bspline *this,double x)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int i;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  iVar7 = this->m_num;
  lVar8 = (long)iVar7;
  if (lVar8 < 3) {
    return 0.0;
  }
  pdVar3 = this->m_x;
  dVar11 = *pdVar3;
  if (dVar11 <= x) {
    dVar11 = pdVar3[lVar8 + -1];
    if (dVar11 <= x) {
      dVar2 = this->m_y[lVar8 + -1];
      pdVar1 = this->m_y + lVar8 + -2;
      auVar15._0_8_ = (this->m_am).m_array[iVar7 - 2U] * (dVar11 - pdVar3[iVar7 - 2U]);
      auVar15._8_8_ = 0;
      auVar4._8_8_ = dVar2 - *pdVar1;
      auVar4._0_8_ = dVar2 - *pdVar1;
      auVar12 = blendpd(auVar15,auVar4,2);
      auVar5._8_8_ = dVar11 - pdVar3[iVar7 - 2U];
      auVar5._0_8_ = 0x4018000000000000;
      auVar12 = divpd(auVar12,auVar5);
      return (x - dVar11) * (auVar12._0_8_ + auVar12._8_8_) + dVar2;
    }
    iVar7 = iVar7 + -1;
    i = 0;
    iVar9 = 0;
    do {
      iVar10 = iVar9 + iVar7 >> 1;
      iVar6 = iVar10;
      if (pdVar3[iVar10] <= x) {
        iVar9 = iVar10;
        iVar6 = iVar7;
        i = iVar10;
      }
      iVar7 = iVar6;
    } while (1 < iVar7 - iVar9);
    dVar11 = interpolation(this,x,i);
    return dVar11;
  }
  dVar2 = *this->m_y;
  pdVar1 = this->m_y + 1;
  auVar12._0_8_ = -(pdVar3[1] - dVar11) * (this->m_am).m_array[1];
  auVar12._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = *pdVar1 - dVar2;
  auVar13._8_8_ = *pdVar1 - dVar2;
  auVar12 = blendpd(auVar12,auVar13,2);
  auVar14._8_8_ = pdVar3[1] - dVar11;
  auVar14._0_8_ = 0x4018000000000000;
  auVar12 = divpd(auVar12,auVar14);
  return (x - dVar11) * (auVar12._0_8_ + auVar12._8_8_) + dVar2;
}

Assistant:

double bspline::get(double x) const
    {
        if(m_num > 2)
        {
            int i;

            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            // Interpolation
            bsearch(m_num, m_x, x, &i);
            return interpolation(x, i);
        }
        return 0.0;
    }